

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

void capnp::_::initTestMessage(Builder builder)

{
  Reader RVar1;
  Reader value;
  Reader value_00;
  Reader value_01;
  Reader value_02;
  ArrayPtr<const_capnp::Void> value_03;
  ArrayPtr<const_bool> value_04;
  ArrayPtr<const_signed_char> value_05;
  ArrayPtr<const_short> value_06;
  ArrayPtr<const_int> value_07;
  ArrayPtr<const_long> value_08;
  ArrayPtr<const_unsigned_char> value_09;
  ArrayPtr<const_unsigned_short> value_10;
  ArrayPtr<const_unsigned_int> value_11;
  ArrayPtr<const_unsigned_long> value_12;
  ArrayPtr<const_float> value_13;
  ArrayPtr<const_double> value_14;
  ArrayPtr<const_capnp::Text::Reader> value_15;
  ArrayPtr<const_capnp::Data::Reader> value_16;
  Reader value_17;
  Reader value_18;
  Reader value_19;
  ArrayPtr<const_capnp::schemas::TestEnum_9c8e9318b29d9cd3> value_20;
  ArrayPtr<const_bool> value_21;
  ArrayPtr<const_signed_char> value_22;
  ArrayPtr<const_short> value_23;
  ArrayPtr<const_int> value_24;
  ArrayPtr<const_long> value_25;
  ArrayPtr<const_unsigned_char> value_26;
  ArrayPtr<const_unsigned_short> value_27;
  ArrayPtr<const_unsigned_int> value_28;
  ArrayPtr<const_unsigned_long> value_29;
  ArrayPtr<const_float> value_30;
  ArrayPtr<const_double> value_31;
  ArrayPtr<const_capnp::Text::Reader> value_32;
  ArrayPtr<const_capnp::Data::Reader> value_33;
  Reader value_34;
  Reader value_35;
  Reader value_36;
  ArrayPtr<const_capnp::schemas::TestEnum_9c8e9318b29d9cd3> value_37;
  Builder subSubBuilder;
  undefined8 uStack_b0;
  StructBuilder local_a8;
  Builder subBuilder;
  Builder local_58;
  
  local_58._builder.data = builder._builder.data;
  local_58._builder.pointers = builder._builder.pointers;
  local_58._builder.dataSize = builder._builder.dataSize;
  local_58._builder.pointerCount = builder._builder.pointerCount;
  local_58._builder._38_2_ = builder._builder._38_2_;
  local_58._builder.segment = builder._builder.segment;
  local_58._builder.capTable = builder._builder.capTable;
  *(byte *)builder._builder.data = *builder._builder.data | 1;
  *(undefined1 *)((long)builder._builder.data + 1) = 0x85;
  *(undefined2 *)((long)builder._builder.data + 2) = 0xcfc7;
  *(undefined4 *)((long)builder._builder.data + 4) = 0xff439eb2;
  *(undefined8 *)((long)builder._builder.data + 8) = 0xffff8fb779f22087;
  *(undefined1 *)((long)builder._builder.data + 0x10) = 0xea;
  *(undefined2 *)((long)builder._builder.data + 0x12) = 0xb26e;
  *(undefined4 *)((long)builder._builder.data + 0x14) = 0xce0a6a14;
  *(undefined8 *)((long)builder._builder.data + 0x18) = 0xab54a98ceb1f0ad2;
  *(undefined4 *)((long)builder._builder.data + 0x20) = 0x449a5000;
  *(undefined8 *)((long)builder._builder.data + 0x28) = 0xc9b58b82c0e0bb00;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&local_58,value);
  RVar1 = data("bar");
  capnproto_test::capnp::test::TestAllTypes::Builder::setDataField(&local_58,RVar1);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField(&subBuilder,&local_58);
  *(byte *)subBuilder._builder.data = *subBuilder._builder.data | 1;
  *(undefined1 *)((long)subBuilder._builder.data + 1) = 0xf4;
  *(undefined2 *)((long)subBuilder._builder.data + 2) = 0xd80;
  *(undefined4 *)((long)subBuilder._builder.data + 4) = 0xfb4c100e;
  *(undefined8 *)((long)subBuilder._builder.data + 8) = 0x33a638e8734e;
  *(undefined1 *)((long)subBuilder._builder.data + 0x10) = 0x5a;
  *(undefined2 *)((long)subBuilder._builder.data + 0x12) = 0x4d2;
  *(undefined4 *)((long)subBuilder._builder.data + 0x14) = 0x3628814;
  *(undefined8 *)((long)subBuilder._builder.data + 0x18) = 0x4cc1921126f0ad2;
  *(undefined4 *)((long)subBuilder._builder.data + 0x20) = 0xaf09705f;
  *(undefined8 *)((long)subBuilder._builder.data + 0x28) = 0x4075900000000000;
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "baz";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&subBuilder,value_00);
  RVar1 = data("qux");
  capnproto_test::capnp::test::TestAllTypes::Builder::setDataField(&subBuilder,RVar1);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField(&subSubBuilder,&subBuilder);
  value_01.super_StringPtr.content.size_ = 7;
  value_01.super_StringPtr.content.ptr = "nested";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&subSubBuilder,value_01);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField
            ((Builder *)&local_a8,&subSubBuilder);
  value_02.super_StringPtr.content.size_ = 0xe;
  value_02.super_StringPtr.content.ptr = "really nested";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField((Builder *)&local_a8,value_02);
  *(undefined2 *)((long)subBuilder._builder.data + 0x24) = 2;
  value_03.size_ = 3;
  value_03.ptr = (Void *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setVoidList(&subBuilder,value_03);
  subSubBuilder._builder.segment._0_5_ = 0x101000100;
  value_04.size_ = 5;
  value_04.ptr = (bool *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setBoolList(&subBuilder,value_04);
  subSubBuilder._builder.segment._0_4_ = 0x7f80de0c;
  value_05.size_ = 4;
  value_05.ptr = (char *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt8List(&subBuilder,value_05);
  subSubBuilder._builder.segment = (SegmentBuilder *)0x7fff8000e9d204d2;
  value_06.size_ = 4;
  value_06.ptr = (short *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt16List(&subBuilder,value_06);
  subSubBuilder._builder.segment = (SegmentBuilder *)0xfaa0d34000bc614e;
  subSubBuilder._builder.capTable = (CapTableBuilder *)0x7fffffff80000000;
  value_07.size_ = 4;
  value_07.ptr = (int *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32List(&subBuilder,value_07);
  subSubBuilder._builder.data = (void *)0x8000000000000000;
  subSubBuilder._builder.pointers = (WirePointer *)0x7fffffffffffffff;
  subSubBuilder._builder.capTable = (CapTableBuilder *)0xfffd968afd13752e;
  subSubBuilder._builder.segment = (SegmentBuilder *)0x7048860ddf79;
  value_08.size_ = 4;
  value_08.ptr = (long *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt64List(&subBuilder,value_08);
  subSubBuilder._builder.segment._0_4_ = 0xff00220c;
  value_09.size_ = 4;
  value_09.ptr = (uchar *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt8List(&subBuilder,value_09);
  subSubBuilder._builder.segment = (SegmentBuilder *)0xffff0000162e04d2;
  value_10.size_ = 4;
  value_10.ptr = (unsigned_short *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt16List(&subBuilder,value_10);
  subSubBuilder._builder.segment = (SegmentBuilder *)0x55f2cc000bc614e;
  subSubBuilder._builder.capTable = (CapTableBuilder *)0xffffffff00000000;
  value_11.size_ = 4;
  value_11.ptr = (uint *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32List(&subBuilder,value_11);
  subSubBuilder._builder.data = (void *)0x0;
  subSubBuilder._builder.pointers = (WirePointer *)0xffffffffffffffff;
  subSubBuilder._builder.segment = (SegmentBuilder *)0x7048860ddf79;
  subSubBuilder._builder.capTable = (CapTableBuilder *)0x2697502ec8ad2;
  value_12.size_ = 4;
  value_12.ptr = (unsigned_long *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt64List(&subBuilder,value_12);
  subSubBuilder._builder.segment = (SegmentBuilder *)0x4996b43800000000;
  subSubBuilder._builder.capTable = (CapTableBuilder *)0xfcf0bdc27cf0bdc2;
  subSubBuilder._builder.data = (void *)0x82081cea02081cea;
  value_13.size_ = 6;
  value_13.ptr = (float *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat32List(&subBuilder,value_13);
  subSubBuilder._builder.dataSize = 0x3750f791;
  subSubBuilder._builder.pointerCount = 0x789e;
  subSubBuilder._builder._38_2_ = 0x66;
  subSubBuilder._builder.data = (void *)0x7f76c8e5ca239029;
  subSubBuilder._builder.pointers = (WirePointer *)0xff76c8e5ca239029;
  subSubBuilder._builder.segment = (SegmentBuilder *)0x0;
  subSubBuilder._builder.capTable = (CapTableBuilder *)0x42dc12218377de40;
  value_14.size_ = 6;
  value_14.ptr = (double *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat64List(&subBuilder,value_14);
  subSubBuilder._builder.capTable = (CapTableBuilder *)&DAT_00000005;
  subSubBuilder._builder.segment = (SegmentBuilder *)"quux";
  subSubBuilder._builder.pointers = (WirePointer *)0x6;
  subSubBuilder._builder.data = "corge";
  uStack_b0 = 7;
  subSubBuilder._builder._32_8_ = "grault";
  value_15.size_ = 3;
  value_15.ptr = (Reader *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextList(&subBuilder,value_15);
  subSubBuilder._builder._0_16_ = data("garply");
  subSubBuilder._builder._16_16_ = data("waldo");
  join_0x00000010_0x00000000_ = (ArrayPtr<const_unsigned_char>)data("fred");
  value_16.size_ = 3;
  value_16.ptr = (Reader *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setDataList(&subBuilder,value_16);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructList
            ((Builder *)&subSubBuilder,&subBuilder,3);
  ListBuilder::getStructElement(&local_a8,(ListBuilder *)&subSubBuilder,0);
  value_17.super_StringPtr.content.size_ = 0xf;
  value_17.super_StringPtr.content.ptr = "x structlist 1";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField((Builder *)&local_a8,value_17);
  ListBuilder::getStructElement(&local_a8,(ListBuilder *)&subSubBuilder,1);
  value_18.super_StringPtr.content.size_ = 0xf;
  value_18.super_StringPtr.content.ptr = "x structlist 2";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField((Builder *)&local_a8,value_18);
  ListBuilder::getStructElement(&local_a8,(ListBuilder *)&subSubBuilder,2);
  value_19.super_StringPtr.content.size_ = 0xf;
  value_19.super_StringPtr.content.ptr = "x structlist 3";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField((Builder *)&local_a8,value_19);
  subSubBuilder._builder.segment._0_6_ = 0x600010003;
  value_20.size_ = 3;
  value_20.ptr = (TestEnum_9c8e9318b29d9cd3 *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setEnumList(&subBuilder,value_20);
  *(undefined2 *)((long)local_58._builder.data + 0x24) = 5;
  capnproto_test::capnp::test::TestAllTypes::Builder::initVoidList
            ((Builder *)&subSubBuilder,&local_58,6);
  subSubBuilder._builder.segment._0_4_ = 0x1000001;
  value_21.size_ = 4;
  value_21.ptr = (bool *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setBoolList(&local_58,value_21);
  subSubBuilder._builder.segment._0_2_ = 0x916f;
  value_22.size_ = 2;
  value_22.ptr = (char *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt8List(&local_58,value_22);
  subSubBuilder._builder.segment._0_4_ = 0xd4992b67;
  value_23.size_ = 2;
  value_23.ptr = (short *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt16List(&local_58,value_23);
  subSubBuilder._builder.segment = (SegmentBuilder *)0xf9609439069f6bc7;
  value_24.size_ = 2;
  value_24.ptr = (int *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32List(&local_58,value_24);
  subSubBuilder._builder.capTable = (CapTableBuilder *)0xf0948a54d43b8e39;
  subSubBuilder._builder.segment = (SegmentBuilder *)0xf6b75ab2bc471c7;
  value_25.size_ = 2;
  value_25.ptr = (long *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt64List(&local_58,value_25);
  subSubBuilder._builder.segment._0_2_ = 0xde6f;
  value_26.size_ = 2;
  value_26.ptr = (uchar *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt8List(&local_58,value_26);
  subSubBuilder._builder.segment._0_4_ = 0xad9c8235;
  value_27.size_ = 2;
  value_27.ptr = (unsigned_short *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt16List(&local_58,value_27);
  subSubBuilder._builder.segment._0_4_ = 0xc6aea155;
  value_28.size_ = 1;
  value_28.ptr = (uint *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32List(&local_58,value_28);
  subSubBuilder._builder.segment = (SegmentBuilder *)0x9a3298afb5ac71c7;
  value_29.size_ = 1;
  value_29.ptr = (unsigned_long *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt64List(&local_58,value_29);
  subSubBuilder._builder.segment = (SegmentBuilder *)0x7f80000045ad9c00;
  subSubBuilder._builder.capTable = (CapTableBuilder *)0x7fc00000ff800000;
  value_30.size_ = 4;
  value_30.ptr = (float *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat32List(&local_58,value_30);
  subSubBuilder._builder.data = (void *)0xfff0000000000000;
  subSubBuilder._builder.pointers = (WirePointer *)0x7ff8000000000000;
  subSubBuilder._builder.segment = (SegmentBuilder *)0x40be61c000000000;
  subSubBuilder._builder.capTable = (CapTableBuilder *)0x7ff0000000000000;
  value_31.size_ = 4;
  value_31.ptr = (double *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat64List(&local_58,value_31);
  subSubBuilder._builder.capTable = (CapTableBuilder *)0x6;
  subSubBuilder._builder.segment = (SegmentBuilder *)"plugh";
  subSubBuilder._builder.pointers = (WirePointer *)0x6;
  subSubBuilder._builder.data = "xyzzy";
  uStack_b0 = 5;
  subSubBuilder._builder._32_8_ = "thud";
  value_32.size_ = 3;
  value_32.ptr = (Reader *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextList(&local_58,value_32);
  subSubBuilder._builder._0_16_ = data("oops");
  subSubBuilder._builder._16_16_ = data("exhausted");
  join_0x00000010_0x00000000_ = (ArrayPtr<const_unsigned_char>)data("rfc3092");
  value_33.size_ = 3;
  value_33.ptr = (Reader *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setDataList(&local_58,value_33);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructList
            ((Builder *)&subSubBuilder,&local_58,3);
  ListBuilder::getStructElement(&subBuilder._builder,(ListBuilder *)&subSubBuilder,0);
  value_34.super_StringPtr.content.size_ = 0xd;
  value_34.super_StringPtr.content.ptr = "structlist 1";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField
            ((Builder *)&subBuilder._builder,value_34);
  ListBuilder::getStructElement(&subBuilder._builder,(ListBuilder *)&subSubBuilder,1);
  value_35.super_StringPtr.content.size_ = 0xd;
  value_35.super_StringPtr.content.ptr = "structlist 2";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField
            ((Builder *)&subBuilder._builder,value_35);
  ListBuilder::getStructElement(&subBuilder._builder,(ListBuilder *)&subSubBuilder,2);
  value_36.super_StringPtr.content.size_ = 0xd;
  value_36.super_StringPtr.content.ptr = "structlist 3";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField
            ((Builder *)&subBuilder._builder,value_36);
  subSubBuilder._builder.segment._0_4_ = 0x70000;
  value_37.size_ = 2;
  value_37.ptr = (TestEnum_9c8e9318b29d9cd3 *)&subSubBuilder;
  capnproto_test::capnp::test::TestAllTypes::Builder::setEnumList(&local_58,value_37);
  return;
}

Assistant:

void initTestMessage(TestAllTypes::Builder builder) { genericInitTestMessage(builder); }